

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OS.cpp
# Opt level: O0

void slang::OS::writeFile(path *path,string_view contents)

{
  bool bVar1;
  const_pointer pvVar2;
  ofstream file;
  path *in_stack_fffffffffffffd78;
  path *in_stack_fffffffffffffd80;
  basic_string_view<char,_std::char_traits<char>_> *this;
  path *in_stack_fffffffffffffd88;
  _Ios_Iostate _Var3;
  basic_ofstream<char,_std::char_traits<char>_> *in_stack_fffffffffffffd90;
  long local_240 [2];
  format in_stack_fffffffffffffdd7;
  char (*in_stack_fffffffffffffdd8) [2];
  path *in_stack_fffffffffffffde0;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  std::filesystem::__cxx11::path::path<char[2],std::filesystem::__cxx11::path>
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd7);
  bVar1 = std::filesystem::__cxx11::operator==(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffd80);
  if (bVar1) {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
    std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
    std::ostream::write((char *)&std::cout,(long)pvVar2);
    std::ostream::flush();
  }
  else {
    std::ofstream::ofstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               (openmode)((ulong)in_stack_fffffffffffffd80 >> 0x20));
    _Var3 = (int)local_240 + (int)*(undefined8 *)(local_240[0] + -0x18);
    std::operator|(_S_failbit,_S_badbit);
    std::ios::exceptions(_Var3);
    this = &local_10;
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(this);
    std::basic_string_view<char,_std::char_traits<char>_>::size(this);
    std::ostream::write((char *)local_240,(long)pvVar2);
    std::ostream::flush();
    std::ofstream::~ofstream(local_240);
  }
  return;
}

Assistant:

void OS::writeFile(const fs::path& path, std::string_view contents) {
    if (path == "-") {
        std::cout.write(contents.data(), (std::streamsize)contents.size());
        std::cout.flush();
    }
    else {
        std::ofstream file(path);
        file.exceptions(std::ios::failbit | std::ios::badbit);
        file.write(contents.data(), (std::streamsize)contents.size());
        file.flush();
    }
}